

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdfrend.c
# Opt level: O0

FT_Error ft_bsdf_render(FT_Renderer_conflict module,FT_GlyphSlot slot,FT_Render_Mode mode,
                       FT_Vector *origin)

{
  uint uVar1;
  FT_Memory memory_00;
  FT_Bitmap *pFVar2;
  SDF_Renderer sdf_module;
  SDF_Raster_Params params;
  FT_Pos y_pad;
  FT_Pos x_pad;
  FT_Bitmap target;
  FT_Renderer_conflict render;
  FT_Bitmap *bitmap;
  FT_Memory memory;
  FT_Vector *pFStack_30;
  FT_Error error;
  FT_Vector *origin_local;
  FT_GlyphSlot pFStack_20;
  FT_Render_Mode mode_local;
  FT_GlyphSlot slot_local;
  FT_Renderer_conflict module_local;
  
  memory._4_4_ = 0;
  pFVar2 = &slot->bitmap;
  target.palette = (void *)0x0;
  y_pad._0_4_ = 0;
  params.spread = 0;
  params.flip_sign = '\0';
  params.flip_y = '\0';
  params.overlaps = '\0';
  params._103_1_ = 0;
  pFStack_30 = origin;
  origin_local._4_4_ = mode;
  pFStack_20 = slot;
  slot_local = (FT_GlyphSlot)module;
  FT_Bitmap_Init((FT_Bitmap *)&x_pad);
  memory_00 = (module->root).memory;
  target.palette = module;
  if (pFStack_20->format == module->glyph_format) {
    if (origin_local._4_4_ == FT_RENDER_MODE_SDF) {
      if (pFStack_30 == (FT_Vector *)0x0) {
        if ((pFStack_20->internal->flags & 1) == 0) {
          memory._4_4_ = 6;
        }
        else {
          if ((pFVar2->rows == 0) || ((slot->bitmap).pitch == 0)) {
            return 0;
          }
          FT_Bitmap_New((FT_Bitmap *)&x_pad);
          y_pad._0_4_ = *(int *)&module[1].root.clazz;
          uVar1 = *(uint *)&module[1].root.clazz;
          params._96_8_ = ZEXT48(uVar1);
          x_pad._0_4_ = pFVar2->rows + uVar1 * 2;
          x_pad._4_4_ = (slot->bitmap).width + (int)y_pad * 2;
          target.buffer._2_1_ = 2;
          target.buffer._0_2_ = 0xff;
          target.rows = x_pad._4_4_;
          target._8_8_ = ft_mem_realloc(memory_00,(long)(int)x_pad._4_4_,0,(ulong)(uint)x_pad,
                                        (void *)0x0,(FT_Error *)((long)&memory + 4));
          if (memory._4_4_ == 0) {
            sdf_module = (SDF_Renderer)&x_pad;
            params.root.source._0_4_ = 8;
            params.root.clip_box.yMax._0_4_ = *(undefined4 *)&module[1].root.clazz;
            params.root.clip_box.yMax._4_1_ = *(undefined1 *)((long)&module[1].root.clazz + 4);
            params.root.clip_box.yMax._5_1_ = *(undefined1 *)((long)&module[1].root.clazz + 5);
            params.root.target = pFVar2;
            memory._4_4_ = (**(code **)((long)target.palette + 0x70))
                                     (*(undefined8 *)((long)target.palette + 0x68),&sdf_module);
          }
        }
      }
      else {
        memory._4_4_ = 7;
      }
    }
    else {
      memory._4_4_ = 0x13;
    }
  }
  else {
    memory._4_4_ = 0x12;
  }
  if (memory._4_4_ == 0) {
    if ((pFStack_20->internal->flags & 1) != 0) {
      ft_mem_free(memory_00,(slot->bitmap).buffer);
      (slot->bitmap).buffer = (uchar *)0x0;
      pFStack_20->internal->flags = pFStack_20->internal->flags & 0xfffffffe;
    }
    memcpy(&pFStack_20->bitmap,&x_pad,0x28);
    pFStack_20->bitmap_top = pFStack_20->bitmap_top + params.spread;
    pFStack_20->bitmap_left = pFStack_20->bitmap_left - (int)y_pad;
    pFStack_20->internal->flags = pFStack_20->internal->flags | 1;
  }
  else if (target._8_8_ != 0) {
    ft_mem_free(memory_00,(void *)target._8_8_);
  }
  return memory._4_4_;
}

Assistant:

static FT_Error
  ft_bsdf_render( FT_Renderer       module,
                  FT_GlyphSlot      slot,
                  FT_Render_Mode    mode,
                  const FT_Vector*  origin )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = NULL;

    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Renderer  render  = NULL;
    FT_Bitmap    target;

    FT_Pos  x_pad = 0;
    FT_Pos  y_pad = 0;

    SDF_Raster_Params  params;
    SDF_Renderer       sdf_module = SDF_RENDERER( module );


    /* initialize the bitmap in case any error occurs */
    FT_Bitmap_Init( &target );

    render = &sdf_module->root;
    memory = render->root.memory;

    /* check whether slot format is correct before rendering */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    /* check whether render mode is correct */
    if ( mode != FT_RENDER_MODE_SDF )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    if ( origin )
    {
      FT_ERROR(( "ft_bsdf_render: can't translate the bitmap\n" ));

      error = FT_THROW( Unimplemented_Feature );
      goto Exit;
    }

    /* Do not generate SDF if the bitmap is not owned by the       */
    /* glyph: it might be that the source buffer is already freed. */
    if ( !( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
    {
      FT_ERROR(( "ft_bsdf_render: can't generate SDF from"
                 " unowned source bitmap\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* nothing to render */
    if ( !bitmap->rows || !bitmap->pitch )
      return FT_Err_Ok;

    FT_Bitmap_New( &target );

    /* padding will simply be equal to `spread` */
    x_pad = sdf_module->spread;
    y_pad = sdf_module->spread;

    /* apply padding, which extends to all directions */
    target.rows  = bitmap->rows  + y_pad * 2;
    target.width = bitmap->width + x_pad * 2;

    /* set up the target bitmap */
    target.pixel_mode = FT_PIXEL_MODE_GRAY;
    target.pitch      = (int)( target.width );
    target.num_grays  = 255;

    if ( FT_ALLOC_MULT( target.buffer, target.rows, target.pitch ) )
      goto Exit;

    /* set up parameters */
    params.root.target = &target;
    params.root.source = bitmap;
    params.root.flags  = FT_RASTER_FLAG_SDF;
    params.spread      = sdf_module->spread;
    params.flip_sign   = sdf_module->flip_sign;
    params.flip_y      = sdf_module->flip_y;

    error = render->raster_render( render->raster,
                                   (const FT_Raster_Params*)&params );

  Exit:
    if ( !error )
    {
      /* the glyph is successfully converted to a SDF */
      if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
      {
        FT_FREE( bitmap->buffer );
        slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
      }

      slot->bitmap           = target;
      slot->bitmap_top      += y_pad;
      slot->bitmap_left     -= x_pad;
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;
    }
    else if ( target.buffer )
      FT_FREE( target.buffer );

    return error;
  }